

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

NETSOCKET net_udp_create(NETADDR bindaddr,int use_random_port)

{
  NETSOCKET sock_00;
  int in_EDI;
  long in_FS_OFFSET;
  NETSOCKET NVar1;
  uint in_stack_00000008;
  int socket_1;
  int socket;
  int recvsize;
  int broadcast;
  NETSOCKET sock;
  sockaddr_in6 addr_1;
  sockaddr_in addr;
  NETADDR tmpbindaddr;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  NETADDR *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 local_60;
  undefined4 local_5c;
  ulong local_58;
  int local_50;
  uint local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = invalid_socket._0_8_;
  local_50 = invalid_socket.ipv6sock;
  local_20 = in_stack_00000008;
  local_5c = 1;
  local_60 = 0x10000;
  if ((in_stack_00000008 & 1) != 0) {
    local_20 = 1;
    netaddr_to_sockaddr_in
              (in_stack_ffffffffffffff60,
               (sockaddr_in *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff78 =
         priv_net_create_socket
                   ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                    (sockaddr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
    if (-1 < in_stack_ffffffffffffff78) {
      local_58 = CONCAT44(in_stack_ffffffffffffff78,(int)local_58) | 1;
      setsockopt(in_stack_ffffffffffffff78,1,6,&local_5c,4);
      setsockopt(in_stack_ffffffffffffff78,1,8,&local_60,4);
    }
  }
  if ((in_stack_00000008 & 2) != 0) {
    local_20 = 2;
    netaddr_to_sockaddr_in6
              (in_stack_ffffffffffffff60,
               (sockaddr_in6 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    in_stack_ffffffffffffff74 =
         priv_net_create_socket
                   ((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                    (sockaddr *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
    if (-1 < in_stack_ffffffffffffff74) {
      local_58 = local_58 | 2;
      local_50 = in_stack_ffffffffffffff74;
      setsockopt(in_stack_ffffffffffffff74,1,6,&local_5c,4);
      setsockopt(in_stack_ffffffffffffff74,1,8,&local_60,4);
    }
  }
  sock_00.ipv4sock = in_stack_ffffffffffffff78;
  sock_00.type = in_stack_ffffffffffffff74;
  sock_00.ipv6sock = in_EDI;
  net_set_non_blocking(sock_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  NVar1.ipv6sock = local_50;
  NVar1.type = (undefined4)local_58;
  NVar1.ipv4sock = local_58._4_4_;
  return NVar1;
}

Assistant:

NETSOCKET net_udp_create(NETADDR bindaddr, int use_random_port)
{
	NETSOCKET sock = invalid_socket;
	NETADDR tmpbindaddr = bindaddr;
	int broadcast = 1;
	int recvsize = 65536;

	if(bindaddr.type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV4;
		netaddr_to_sockaddr_in(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET, SOCK_DGRAM, (struct sockaddr *)&addr, sizeof(addr), use_random_port);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV4;
			sock.ipv4sock = socket;

			/* set broadcast */
			setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (const char*)&broadcast, sizeof(broadcast));

			/* set receive buffer size */
			setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&recvsize, sizeof(recvsize));
		}
	}

	if(bindaddr.type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV6;
		netaddr_to_sockaddr_in6(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET6, SOCK_DGRAM, (struct sockaddr *)&addr, sizeof(addr), use_random_port);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV6;
			sock.ipv6sock = socket;

			/* set broadcast */
			setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (const char*)&broadcast, sizeof(broadcast));

			/* set receive buffer size */
			setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&recvsize, sizeof(recvsize));
		}
	}

	/* set non-blocking */
	net_set_non_blocking(sock);

	/* return */
	return sock;
}